

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_close.c
# Opt level: O1

int torrentzip_compare_names(void *a,void *b)

{
  char *__s2;
  int iVar1;
  
  __s2 = *(char **)((long)b + 8);
  if (*(char **)((long)a + 8) == (char *)0x0) {
    return -(uint)(__s2 != (char *)0x0);
  }
  if (__s2 == (char *)0x0) {
    return 1;
  }
  iVar1 = strcasecmp(*(char **)((long)a + 8),__s2);
  return iVar1;
}

Assistant:

static int torrentzip_compare_names(const void *a, const void *b) {
    const char *aname = ((const zip_filelist_t *)a)->name;
    const char *bname = ((const zip_filelist_t *)b)->name;

    if (aname == NULL) {
        return (bname != NULL) * -1;
    }
    else if (bname == NULL) {
        return 1;
    }

    return strcasecmp(aname, bname);
}